

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall
wasm::OptimizeInstructions::optimizeTernary<wasm::If>(OptimizeInstructions *this,If *curr)

{
  element_type *peVar1;
  pointer *this_00;
  Id IVar2;
  Type type;
  uintptr_t uVar3;
  Expression *pEVar4;
  bool bVar5;
  pointer pppEVar6;
  bool bVar7;
  Id IVar8;
  Index IVar9;
  int64_t iVar10;
  ulong uVar11;
  Expression **ppEVar12;
  Expression *pEVar13;
  Expression ***pppEVar14;
  Const **ppCVar15;
  Expression *pEVar16;
  bool bVar17;
  undefined1 local_128 [8];
  ChildIterator ifFalseChildren;
  Const *c;
  void *local_c0;
  long local_b0;
  undefined1 local_a8 [8];
  SmallVector<wasm::Expression_*,_1UL> chain;
  undefined1 local_78 [8];
  ChildIterator ifTrueChildren;
  Expression *reuse;
  
  chain.flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)this;
  if ((((curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id != 1) &&
      (pEVar16 = curr->ifTrue, (pEVar16->type).id != 1)) &&
     (pEVar13 = curr->ifFalse, (pEVar13->type).id != 1)) {
    peVar1 = (element_type *)
             ((long)&ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.
                     flexible.
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                     _M_impl.super__Vector_impl_data + 0x10);
    ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems[0] =
         (Expression **)0x0;
    ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems[2] =
         (Expression **)0x0;
    if (pEVar13->_id == ConstId) {
      ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pEVar13;
      local_78 = (undefined1  [8])peVar1;
      Literal::Literal((Literal *)local_128,(Literal *)(pEVar13 + 1));
      bVar7 = Match::Internal::
              Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_>
              ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_>
                         *)&ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children
                            .fixed,(Literal *)local_128);
      Literal::~Literal((Literal *)local_128);
      if (((bVar7) && (pEVar16->_id == UnaryId)) &&
         (IVar2 = pEVar16[1]._id,
         IVar8 = Match::Internal::AbstractUnaryOpK::getOp
                           ((Type)*(uintptr_t *)(pEVar16[1].type.id + 8),EqZ), IVar2 == IVar8))
      goto LAB_007fac49;
    }
    pEVar13 = curr->ifTrue;
    pEVar16 = curr->ifFalse;
    ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems[0] =
         (Expression **)0x0;
    ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems[2] =
         (Expression **)0x0;
    local_78 = (undefined1  [8])peVar1;
    if (pEVar13->_id == ConstId) {
      ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pEVar13;
      Literal::Literal((Literal *)local_128,(Literal *)(pEVar13 + 1));
      bVar7 = Match::Internal::
              Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_>
              ::matches((Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_>
                         *)&ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children
                            .fixed,(Literal *)local_128);
      Literal::~Literal((Literal *)local_128);
      if (((bVar7) && (pEVar16->_id == UnaryId)) &&
         (IVar2 = pEVar16[1]._id,
         IVar8 = Match::Internal::AbstractUnaryOpK::getOp
                           ((Type)*(uintptr_t *)(pEVar16[1].type.id + 8),EqZ), IVar2 == IVar8)) {
LAB_007fac49:
        pEVar13 = (Expression *)pEVar16[1].type.id;
        type.id = (pEVar13->type).id;
        if (pEVar16 != curr->ifTrue) {
          iVar10 = Literal::getInteger((Literal *)
                                       (ifFalseChildren.
                                        super_AbstractChildIterator<wasm::ChildIterator>.children.
                                        flexible.
                                        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
          Literal::makeFromInt32((Literal *)local_78,1 - (int)iVar10,type);
          Literal::operator=((Literal *)
                             (ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.
                              children.flexible.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 2),
                             (Literal *)local_78);
          Literal::~Literal((Literal *)local_78);
          ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[1] = (Expression **)type.id;
          pEVar13 = (Expression *)
                    ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.
                    flexible.
                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        curr->ifTrue = pEVar13;
        if (pEVar16 == curr->ifFalse) {
          pEVar13 = (Expression *)pEVar16[1].type.id;
        }
        else {
          iVar10 = Literal::getInteger((Literal *)
                                       (ifFalseChildren.
                                        super_AbstractChildIterator<wasm::ChildIterator>.children.
                                        flexible.
                                        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
          Literal::makeFromInt32((Literal *)local_78,1 - (int)iVar10,type);
          Literal::operator=((Literal *)
                             (ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.
                              children.flexible.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 2),
                             (Literal *)local_78);
          Literal::~Literal((Literal *)local_78);
          ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[1] = (Expression **)type.id;
          pEVar13 = (Expression *)
                    ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.
                    flexible.
                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        curr->ifFalse = pEVar13;
        pEVar16[1].type.id = (uintptr_t)curr;
        If::finalize(curr,type);
        replaceCurrent((OptimizeInstructions *)
                       chain.flexible.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,pEVar16);
        return;
      }
    }
  }
  local_a8 = (undefined1  [8])0x0;
  chain.fixed._M_elems[0] = (_Type)(Expression *)0x0;
  chain.flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  chain.flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    uVar11 = (ulong)curr->ifTrue->_id;
    if (((uVar11 < 0x32) && ((0x200000000000eU >> (uVar11 & 0x3f) & 1) != 0)) ||
       (bVar7 = ExpressionAnalyzer::shallowEqual(curr->ifTrue,curr->ifFalse), !bVar7)) break;
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
              ((AbstractChildIterator<wasm::ChildIterator> *)local_78,curr->ifTrue);
    if ((long)(((Literals *)((long)local_78 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed.
              _M_elems +
        ((long)ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl
               .super__Vector_impl_data._M_start -
         (long)ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
               _M_elems[3] >> 3) + -0x10 == 1) {
      AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                ((AbstractChildIterator<wasm::ChildIterator> *)local_128,curr->ifFalse);
      IVar9 = AbstractChildIterator<wasm::ChildIterator>::mapIndex
                        ((AbstractChildIterator<wasm::ChildIterator> *)local_78,0);
      pppEVar14 = (Expression ***)
                  (ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                   _M_elems[3] + ((ulong)IVar9 - 4));
      if (IVar9 < 4) {
        pppEVar14 = ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                    _M_elems + ((ulong)IVar9 - 1);
      }
      pEVar16 = **pppEVar14;
      IVar9 = AbstractChildIterator<wasm::ChildIterator>::mapIndex
                        ((AbstractChildIterator<wasm::ChildIterator> *)local_128,0);
      pppEVar14 = (Expression ***)
                  (ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                   _M_elems[3] + ((ulong)IVar9 - 4));
      if (IVar9 < 4) {
        pppEVar14 = ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                    _M_elems + ((ulong)IVar9 - 1);
      }
      pEVar13 = curr->ifFalse;
      uVar3 = (curr->ifTrue->type).id;
      if (uVar3 != (pEVar13->type).id) {
        __assert_fail("curr->ifTrue->type == curr->ifFalse->type",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                      ,0x1430,"void wasm::OptimizeInstructions::optimizeTernary(T *) [T = wasm::If]"
                     );
      }
      pEVar4 = **pppEVar14;
      bVar17 = (pEVar16->type).id != (pEVar4->type).id;
      bVar7 = ((curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id !=
              1) == (uVar3 == 1);
      bVar5 = false;
      if (!bVar7 && !bVar17) {
        curr->ifTrue = pEVar16;
        curr->ifFalse = pEVar4;
        ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)pEVar13;
        If::finalize(curr);
        this_00 = (pointer *)
                  ((long)&ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.
                          flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data + 0x10);
        AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                  ((AbstractChildIterator<wasm::ChildIterator> *)this_00,
                   (Expression *)
                   ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible
                   .super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
        IVar9 = AbstractChildIterator<wasm::ChildIterator>::mapIndex
                          ((AbstractChildIterator<wasm::ChildIterator> *)this_00,0);
        ppCVar15 = (Const **)((long)local_c0 + (ulong)IVar9 * 8 + -0x20);
        if (IVar9 < 4) {
          ppCVar15 = &c + IVar9;
        }
        *(If **)&((*ppCVar15)->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression
             = curr;
        if (local_c0 != (void *)0x0) {
          operator_delete(local_c0,local_b0 - (long)local_c0);
        }
        pppEVar6 = ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible
                   .super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (((long)chain.flexible.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start - (long)chain.fixed._M_elems[0] >> 3) +
            (long)local_a8 != 0) {
          ppEVar12 = SmallVector<wasm::Expression_*,_1UL>::back
                               ((SmallVector<wasm::Expression_*,_1UL> *)local_a8);
          AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                    ((AbstractChildIterator<wasm::ChildIterator> *)this_00,*ppEVar12);
          IVar9 = AbstractChildIterator<wasm::ChildIterator>::mapIndex
                            ((AbstractChildIterator<wasm::ChildIterator> *)this_00,0);
          ppCVar15 = (Const **)((long)local_c0 + (ulong)IVar9 * 8 + -0x20);
          if (IVar9 < 4) {
            ppCVar15 = &c + IVar9;
          }
          *(pointer *)
           &((*ppCVar15)->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression =
               pppEVar6;
          if (local_c0 != (void *)0x0) {
            operator_delete(local_c0,local_b0 - (long)local_c0);
          }
        }
        SmallVector<wasm::Expression_*,_1UL>::push_back
                  ((SmallVector<wasm::Expression_*,_1UL> *)local_a8,
                   (Expression **)
                   ((long)&ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.
                           flexible.
                           super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                           ._M_impl.super__Vector_impl_data + 0x10));
        bVar5 = true;
      }
      if (ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems
          [3] != (Expression **)0x0) {
        operator_delete(ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.
                        fixed._M_elems[3],
                        (long)ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.
                              children.flexible.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.
                              children.fixed._M_elems[3]);
      }
      if (bVar7 || bVar17) goto LAB_007faf57;
    }
    else {
LAB_007faf57:
      bVar5 = false;
    }
    if (ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems[3]
        != (Expression **)0x0) {
      operator_delete(ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed
                      ._M_elems[3],
                      (long)ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children
                            .flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)ifTrueChildren.super_AbstractChildIterator<wasm::ChildIterator>.children
                            .fixed._M_elems[3]);
    }
  } while (bVar5);
  if (((long)chain.flexible.
             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_start - (long)chain.fixed._M_elems[0] >> 3) + (long)local_a8
      != 0) {
    replaceCurrent((OptimizeInstructions *)
                   chain.flexible.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,(Expression *)chain.usedFixed);
  }
  if (chain.fixed._M_elems[0] != (Expression *)0x0) {
    operator_delete((void *)chain.fixed._M_elems[0],
                    (long)chain.flexible.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)chain.fixed._M_elems[0]
                   );
  }
  return;
}

Assistant:

void optimizeTernary(T* curr) {
    using namespace Abstract;
    using namespace Match;
    Builder builder(*getModule());

    // If one arm is an operation and the other is an appropriate constant, we
    // can move the operation outside (where it may be further optimized), e.g.
    //
    //  (select
    //    (i32.eqz (X))
    //    (i32.const 0|1)
    //    (Y)
    //  )
    // =>
    //  (i32.eqz
    //    (select
    //      (X)
    //      (i32.const 1|0)
    //      (Y)
    //    )
    //  )
    //
    // Ignore unreachable code here; leave that for DCE.
    if (curr->type != Type::unreachable &&
        curr->ifTrue->type != Type::unreachable &&
        curr->ifFalse->type != Type::unreachable) {
      Unary* un;
      Const* c;
      auto check = [&](Expression* a, Expression* b) {
        return matches(b, bval(&c)) && matches(a, unary(&un, EqZ, any()));
      };
      if (check(curr->ifTrue, curr->ifFalse) ||
          check(curr->ifFalse, curr->ifTrue)) {
        // The new type of curr will be that of the value of the unary, as after
        // we move the unary out, its value is curr's direct child.
        auto newType = un->value->type;
        auto updateArm = [&](Expression* arm) -> Expression* {
          if (arm == un) {
            // This is the arm that had the eqz, which we need to remove.
            return un->value;
          } else {
            // This is the arm with the constant, which we need to flip.
            // Note that we also need to set the type to match the other arm.
            c->value =
              Literal::makeFromInt32(1 - c->value.getInteger(), newType);
            c->type = newType;
            return c;
          }
        };
        curr->ifTrue = updateArm(curr->ifTrue);
        curr->ifFalse = updateArm(curr->ifFalse);
        un->value = curr;
        curr->finalize(newType);
        return replaceCurrent(un);
      }
    }

    {
      // Identical code on both arms can be folded out, e.g.
      //
      //  (select
      //    (i32.eqz (X))
      //    (i32.eqz (Y))
      //    (Z)
      //  )
      // =>
      //  (i32.eqz
      //    (select
      //      (X)
      //      (Y)
      //      (Z)
      //    )
      //  )
      //
      // Continue doing this while we can, noting the chain of moved expressions
      // as we go, then do a single replaceCurrent() at the end.
      SmallVector<Expression*, 1> chain;
      while (1) {
        // Ignore control flow structures (which are handled in MergeBlocks).
        if (!Properties::isControlFlowStructure(curr->ifTrue) &&
            ExpressionAnalyzer::shallowEqual(curr->ifTrue, curr->ifFalse)) {
          // TODO: consider the case with more than one child.
          ChildIterator ifTrueChildren(curr->ifTrue);
          if (ifTrueChildren.children.size() == 1) {
            // ifTrue and ifFalse's children will become the direct children of
            // curr, and so they must be compatible to allow for a proper new
            // type after the transformation.
            //
            // At minimum an LUB is required, as shown here:
            //
            //  (if
            //    (condition)
            //    (drop (i32.const 1))
            //    (drop (f64.const 2.0))
            //  )
            //
            // However, that may not be enough, as with nominal types we can
            // have things like this:
            //
            //  (if
            //    (condition)
            //    (struct.get $A 1 (..))
            //    (struct.get $B 1 (..))
            //  )
            //
            // It is possible that the LUB of $A and $B does not contain field
            // "1". With structural types this specific problem is not possible,
            // and it appears to be the case that with the GC MVP there is no
            // instruction that poses a problem, but in principle it can happen
            // there as well, if we add an instruction that returns the number
            // of fields in a type, for example. For that reason, and to avoid
            // a difference between structural and nominal typing here, disallow
            // subtyping in both. (Note: In that example, the problem only
            // happens because the type is not part of the struct.get - we infer
            // it from the reference. That is why after hoisting the struct.get
            // out, and computing a new type for the if that is now the child of
            // the single struct.get, we get a struct.get of a supertype. So in
            // principle we could fix this by modifying the IR as well, but the
            // problem is more general, so avoid that.)
            ChildIterator ifFalseChildren(curr->ifFalse);
            auto* ifTrueChild = *ifTrueChildren.begin();
            auto* ifFalseChild = *ifFalseChildren.begin();
            bool validTypes = ifTrueChild->type == ifFalseChild->type;

            // In addition, after we move code outside of curr then we need to
            // not change unreachability - if we did, we'd need to propagate
            // that further, and we leave such work to DCE and Vacuum anyhow.
            // This can happen in something like this for example, where the
            // outer type changes from i32 to unreachable if we move the
            // returns outside:
            //
            //  (if (result i32)
            //    (local.get $x)
            //    (return
            //      (local.get $y)
            //    )
            //    (return
            //      (local.get $z)
            //    )
            //  )
            assert(curr->ifTrue->type == curr->ifFalse->type);
            auto newOuterType = curr->ifTrue->type;
            if ((newOuterType == Type::unreachable) !=
                (curr->type == Type::unreachable)) {
              validTypes = false;
            }

            // If the expression we are about to move outside has side effects,
            // then we cannot do so in general with a select: we'd be reducing
            // the amount of the effects as well as moving them. For an if,
            // the side effects execute once, so there is no problem.
            // TODO: handle certain side effects when possible in select
            bool validEffects = std::is_same<T, If>::value ||
                                !ShallowEffectAnalyzer(
                                   getPassOptions(), *getModule(), curr->ifTrue)
                                   .hasSideEffects();

            // In addition, check for specific limitations of select.
            bool validChildren =
              !std::is_same<T, Select>::value ||
              Properties::canEmitSelectWithArms(ifTrueChild, ifFalseChild);

            if (validTypes && validEffects && validChildren) {
              // Replace ifTrue with its child.
              curr->ifTrue = ifTrueChild;
              // Relace ifFalse with its child, and reuse that node outside.
              auto* reuse = curr->ifFalse;
              curr->ifFalse = ifFalseChild;
              // curr's type may have changed, if the instructions we moved out
              // had different input types than output types.
              curr->finalize();
              // Point to curr from the code that is now outside of it.
              *ChildIterator(reuse).begin() = curr;
              if (!chain.empty()) {
                // We've already moved things out, so chain them to there. That
                // is, the end of the chain should now point to reuse (which
                // in turn already points to curr).
                *ChildIterator(chain.back()).begin() = reuse;
              }
              chain.push_back(reuse);
              continue;
            }
          }
        }
        break;
      }
      if (!chain.empty()) {
        // The beginning of the chain is the new top parent.
        return replaceCurrent(chain[0]);
      }
    }
  }